

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventloop.c
# Opt level: O3

void * aura_eventloop_create_empty(void)

{
  int iVar1;
  aura_eventloop *__ptr;
  aura_eventloop_module *paVar2;
  
  __ptr = (aura_eventloop *)calloc(1,0x30);
  if (__ptr != (aura_eventloop *)0x0) {
    (__ptr->nodelist).next = &__ptr->nodelist;
    (__ptr->nodelist).prev = &__ptr->nodelist;
    __ptr->poll_timeout = 5000;
    paVar2 = aura_eventloop_module_get();
    __ptr->module = paVar2;
    if (paVar2 == (aura_eventloop_module *)0x0) {
      BUG((aura_node *)0x0,"Internal BUG - no eventloop module selected!");
    }
    iVar1 = (*paVar2->create)(__ptr);
    if (iVar1 == 0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void *aura_eventloop_create_empty()
{
	struct aura_eventloop *loop = calloc(1, sizeof(*loop));

	if (!loop)
		return NULL;

	INIT_LIST_HEAD(&loop->nodelist);
	loop->poll_timeout = 5000;
	loop->module = aura_eventloop_module_get();

	if (!loop->module)
		BUG(NULL, "Internal BUG - no eventloop module selected!");

	if (0 != loop->module->create(loop))
		goto err_free_loop;

	/* Just return the loop, we're good */
	return loop;

err_free_loop:
	free(loop);
	return NULL;
}